

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTableScanState::TableScanFunc
          (DuckTableScanState *this,ClientContext *context,TableFunctionInput *data_p,
          DataChunk *output)

{
  TableScanState *state;
  FunctionData *pFVar1;
  _func_int **pp_Var2;
  LocalTableFunctionState *pLVar3;
  bool bVar4;
  DuckTransaction *transaction;
  DataTable *this_00;
  ClientConfig *pCVar5;
  DataChunk *this_01;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  pp_Var2 = pFVar1[4]._vptr_FunctionData;
  transaction = DuckTransaction::Get(context,(Catalog *)pp_Var2[0x1b]);
  this_00 = (DataTable *)(**(code **)(*pp_Var2 + 0x80))(pp_Var2);
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar3 = (data_p->local_state).ptr;
  pCVar5 = ClientConfig::GetConfig(context);
  state = (TableScanState *)(pLVar3 + 1);
  *(bool *)&pLVar3[0x23]._vptr_LocalTableFunctionState = pCVar5->force_fetch_row;
  this_01 = (DataChunk *)(pLVar3 + 0x3b);
  while( true ) {
    if (*(char *)((long)&pFVar1[5]._vptr_FunctionData + 1) == '\x01') {
      DataTable::CreateIndexScan
                (this_00,state,output,TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED);
    }
    else if ((this->super_TableScanGlobalState).projection_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (this->super_TableScanGlobalState).projection_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish) {
      DataTable::Scan(this_00,transaction,output,state);
    }
    else {
      DataChunk::Reset(this_01);
      DataTable::Scan(this_00,transaction,this_01,state);
      DataChunk::ReferenceColumns(output,this_01,&(this->super_TableScanGlobalState).projection_ids)
      ;
    }
    if (output->count != 0) break;
    bVar4 = DataTable::NextParallelScan(this_00,context,&this->state,state);
    if (!bVar4) {
      return;
    }
  }
  return;
}

Assistant:

void TableScanFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) override {
		auto &bind_data = data_p.bind_data->Cast<TableScanBindData>();
		auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
		auto &tx = DuckTransaction::Get(context, duck_table.catalog);
		auto &storage = duck_table.GetStorage();

		auto &l_state = data_p.local_state->Cast<TableScanLocalState>();
		l_state.scan_state.options.force_fetch_row = ClientConfig::GetConfig(context).force_fetch_row;

		do {
			if (bind_data.is_create_index) {
				storage.CreateIndexScan(l_state.scan_state, output,
				                        TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED);
			} else if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				storage.Scan(tx, l_state.all_columns, l_state.scan_state);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				storage.Scan(tx, output, l_state.scan_state);
			}
			if (output.size() > 0) {
				return;
			}

			auto next = storage.NextParallelScan(context, state, l_state.scan_state);
			if (!next) {
				return;
			}
		} while (true);
	}